

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
Graph<unsigned_long,_scc::VectorType>::scc
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Graph<unsigned_long,_scc::VectorType> *this)

{
  pointer *ppvVar1;
  iterator __position;
  pointer pvVar2;
  iterator __position_00;
  pointer pNVar3;
  pointer pNVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 uVar34;
  bool *pbVar35;
  ulong uVar36;
  ulong uVar37;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  *__range4;
  pointer ppNVar38;
  __normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
  __tmp;
  pointer ppNVar39;
  Container *__range2;
  undefined1 auVar40 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar63;
  int iVar64;
  undefined1 auVar61 [16];
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  reversed_topological_order;
  undefined1 local_78 [16];
  pointer local_68;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  local_60;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  local_48;
  
  dual_dfs(&local_48,this);
  if (local_48.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dual_dfs(&local_60,this);
  ppNVar38 = local_60.
             super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_60.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_60.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      ppNVar39 = local_60.
                 super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (local_60.
          super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->visited == false) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::_M_realloc_insert<>(__return_storage_ptr__,__position);
        }
        else {
          ((__position._M_current)->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppvVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        local_78 = (undefined1  [16])0x0;
        local_68 = (pointer)0x0;
        Node::primal_dfs(*ppNVar39,
                         (vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                          *)local_78);
        uVar34 = local_78._8_8_;
        ppNVar38 = (pointer)local_78._0_8_;
        if (local_78._0_8_ != local_78._8_8_) {
          do {
            pvVar2 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            __position_00._M_current =
                 pvVar2[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                pvVar2[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar2 + -1),
                         __position_00,&(*ppNVar38)->name);
            }
            else {
              *__position_00._M_current = (*ppNVar38)->name;
              pvVar2[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = __position_00._M_current + 1;
            }
            ppNVar38 = ppNVar38 + 1;
          } while (ppNVar38 != (pointer)uVar34);
        }
        ppNVar38 = local_60.
                   super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((pointer)local_78._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
          ppNVar38 = local_60.
                     super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      local_60.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppNVar39;
    } while (ppNVar39 != ppNVar38);
  }
  auVar33 = _DAT_00107090;
  auVar32 = _DAT_00107080;
  auVar31 = _DAT_00107070;
  auVar30 = _DAT_00107060;
  auVar29 = _DAT_00107050;
  auVar28 = _DAT_00107040;
  auVar27 = _DAT_00107030;
  pNVar3 = (this->nodes).
           super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar4 = (this->nodes).
           super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar3 != pNVar4) {
    uVar36 = (long)pNVar4 + (-0x40 - (long)pNVar3);
    auVar61._8_4_ = (int)uVar36;
    auVar61._0_8_ = uVar36;
    auVar61._12_4_ = (int)(uVar36 >> 0x20);
    auVar40._0_8_ = uVar36 >> 6;
    auVar40._8_8_ = auVar61._8_8_ >> 6;
    pbVar35 = &pNVar3[0xf].visited;
    uVar37 = 0;
    do {
      auVar58._8_4_ = (int)uVar37;
      auVar58._0_8_ = uVar37;
      auVar58._12_4_ = (int)(uVar37 >> 0x20);
      auVar61 = auVar40 ^ auVar33;
      auVar66 = (auVar58 | auVar32) ^ auVar33;
      iVar60 = auVar61._0_4_;
      iVar79 = -(uint)(iVar60 < auVar66._0_4_);
      iVar63 = auVar61._4_4_;
      auVar68._4_4_ = -(uint)(iVar63 < auVar66._4_4_);
      iVar64 = auVar61._8_4_;
      iVar83 = -(uint)(iVar64 < auVar66._8_4_);
      iVar65 = auVar61._12_4_;
      auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
      auVar41._4_4_ = iVar79;
      auVar41._0_4_ = iVar79;
      auVar41._8_4_ = iVar83;
      auVar41._12_4_ = iVar83;
      auVar61 = pshuflw(in_XMM1,auVar41,0xe8);
      auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar63);
      auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar50 = pshuflw(in_XMM2,auVar67,0xe8);
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar41 = pshuflw(auVar61,auVar68,0xe8);
      auVar66._8_4_ = 0xffffffff;
      auVar66._0_8_ = 0xffffffffffffffff;
      auVar66._12_4_ = 0xffffffff;
      auVar66 = (auVar41 | auVar50 & auVar61) ^ auVar66;
      auVar61 = packssdw(auVar66,auVar66);
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar35[-0x3c0] = false;
      }
      auVar14._4_4_ = iVar79;
      auVar14._0_4_ = iVar79;
      auVar14._8_4_ = iVar83;
      auVar14._12_4_ = iVar83;
      auVar68 = auVar67 & auVar14 | auVar68;
      auVar61 = packssdw(auVar68,auVar68);
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar50,auVar61 ^ auVar50);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._0_4_ >> 8 & 1) != 0) {
        pbVar35[-0x380] = false;
      }
      auVar61 = (auVar58 | auVar31) ^ auVar33;
      auVar51._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar51._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar51._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar51._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar69._4_4_ = auVar51._0_4_;
      auVar69._0_4_ = auVar51._0_4_;
      auVar69._8_4_ = auVar51._8_4_;
      auVar69._12_4_ = auVar51._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar15._4_4_ = iVar79;
      auVar15._0_4_ = iVar79;
      auVar15._8_4_ = iVar83;
      auVar15._12_4_ = iVar83;
      auVar80._4_4_ = auVar51._4_4_;
      auVar80._0_4_ = auVar51._4_4_;
      auVar80._8_4_ = auVar51._12_4_;
      auVar80._12_4_ = auVar51._12_4_;
      auVar61 = auVar15 & auVar69 | auVar80;
      auVar61 = packssdw(auVar61,auVar61);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar5,auVar61 ^ auVar5);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._0_4_ >> 0x10 & 1) != 0) {
        pbVar35[-0x340] = false;
      }
      auVar61 = pshufhw(auVar61,auVar69,0x84);
      auVar16._4_4_ = iVar79;
      auVar16._0_4_ = iVar79;
      auVar16._8_4_ = iVar83;
      auVar16._12_4_ = iVar83;
      auVar41 = pshufhw(auVar51,auVar16,0x84);
      auVar66 = pshufhw(auVar61,auVar80,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar66 | auVar41 & auVar61) ^ auVar42;
      auVar61 = packssdw(auVar42,auVar42);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._0_4_ >> 0x18 & 1) != 0) {
        pbVar35[-0x300] = false;
      }
      auVar61 = (auVar58 | auVar30) ^ auVar33;
      auVar52._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar52._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar52._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar52._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar17._4_4_ = auVar52._0_4_;
      auVar17._0_4_ = auVar52._0_4_;
      auVar17._8_4_ = auVar52._8_4_;
      auVar17._12_4_ = auVar52._8_4_;
      auVar41 = pshuflw(auVar80,auVar17,0xe8);
      auVar43._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar43._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar43._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar43._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar70._4_4_ = auVar43._4_4_;
      auVar70._0_4_ = auVar43._4_4_;
      auVar70._8_4_ = auVar43._12_4_;
      auVar70._12_4_ = auVar43._12_4_;
      auVar61 = pshuflw(auVar43,auVar70,0xe8);
      auVar71._4_4_ = auVar52._4_4_;
      auVar71._0_4_ = auVar52._4_4_;
      auVar71._8_4_ = auVar52._12_4_;
      auVar71._12_4_ = auVar52._12_4_;
      auVar66 = pshuflw(auVar52,auVar71,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 & auVar41,(auVar66 | auVar61 & auVar41) ^ auVar6);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar35[-0x2c0] = false;
      }
      auVar18._4_4_ = auVar52._0_4_;
      auVar18._0_4_ = auVar52._0_4_;
      auVar18._8_4_ = auVar52._8_4_;
      auVar18._12_4_ = auVar52._8_4_;
      auVar71 = auVar70 & auVar18 | auVar71;
      auVar66 = packssdw(auVar71,auVar71);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61,auVar66 ^ auVar7);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._4_2_ >> 8 & 1) != 0) {
        pbVar35[-0x280] = false;
      }
      auVar61 = (auVar58 | auVar29) ^ auVar33;
      auVar53._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar53._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar53._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar53._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar72._4_4_ = auVar53._0_4_;
      auVar72._0_4_ = auVar53._0_4_;
      auVar72._8_4_ = auVar53._8_4_;
      auVar72._12_4_ = auVar53._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar19._4_4_ = iVar79;
      auVar19._0_4_ = iVar79;
      auVar19._8_4_ = iVar83;
      auVar19._12_4_ = iVar83;
      auVar81._4_4_ = auVar53._4_4_;
      auVar81._0_4_ = auVar53._4_4_;
      auVar81._8_4_ = auVar53._12_4_;
      auVar81._12_4_ = auVar53._12_4_;
      auVar61 = auVar19 & auVar72 | auVar81;
      auVar61 = packssdw(auVar61,auVar61);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar8,auVar61 ^ auVar8);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar35[-0x240] = false;
      }
      auVar61 = pshufhw(auVar61,auVar72,0x84);
      auVar20._4_4_ = iVar79;
      auVar20._0_4_ = iVar79;
      auVar20._8_4_ = iVar83;
      auVar20._12_4_ = iVar83;
      auVar41 = pshufhw(auVar53,auVar20,0x84);
      auVar66 = pshufhw(auVar61,auVar81,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar66 | auVar41 & auVar61) ^ auVar44;
      auVar61 = packssdw(auVar44,auVar44);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._6_2_ >> 8 & 1) != 0) {
        pbVar35[-0x200] = false;
      }
      auVar61 = (auVar58 | auVar28) ^ auVar33;
      auVar54._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar54._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar54._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar54._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar21._4_4_ = auVar54._0_4_;
      auVar21._0_4_ = auVar54._0_4_;
      auVar21._8_4_ = auVar54._8_4_;
      auVar21._12_4_ = auVar54._8_4_;
      auVar41 = pshuflw(auVar81,auVar21,0xe8);
      auVar45._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar45._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar45._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar45._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar73._4_4_ = auVar45._4_4_;
      auVar73._0_4_ = auVar45._4_4_;
      auVar73._8_4_ = auVar45._12_4_;
      auVar73._12_4_ = auVar45._12_4_;
      auVar61 = pshuflw(auVar45,auVar73,0xe8);
      auVar74._4_4_ = auVar54._4_4_;
      auVar74._0_4_ = auVar54._4_4_;
      auVar74._8_4_ = auVar54._12_4_;
      auVar74._12_4_ = auVar54._12_4_;
      auVar66 = pshuflw(auVar54,auVar74,0xe8);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar55 = (auVar66 | auVar61 & auVar41) ^ auVar55;
      auVar66 = packssdw(auVar55,auVar55);
      auVar61 = packsswb(auVar61 & auVar41,auVar66);
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar35[-0x1c0] = false;
      }
      auVar22._4_4_ = auVar54._0_4_;
      auVar22._0_4_ = auVar54._0_4_;
      auVar22._8_4_ = auVar54._8_4_;
      auVar22._12_4_ = auVar54._8_4_;
      auVar74 = auVar73 & auVar22 | auVar74;
      auVar66 = packssdw(auVar74,auVar74);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar66 = packssdw(auVar66 ^ auVar9,auVar66 ^ auVar9);
      auVar61 = packsswb(auVar61,auVar66);
      if ((auVar61._8_2_ >> 8 & 1) != 0) {
        pbVar35[-0x180] = false;
      }
      auVar61 = (auVar58 | auVar27) ^ auVar33;
      auVar56._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar56._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar56._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar56._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar75._4_4_ = auVar56._0_4_;
      auVar75._0_4_ = auVar56._0_4_;
      auVar75._8_4_ = auVar56._8_4_;
      auVar75._12_4_ = auVar56._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar23._4_4_ = iVar79;
      auVar23._0_4_ = iVar79;
      auVar23._8_4_ = iVar83;
      auVar23._12_4_ = iVar83;
      auVar82._4_4_ = auVar56._4_4_;
      auVar82._0_4_ = auVar56._4_4_;
      auVar82._8_4_ = auVar56._12_4_;
      auVar82._12_4_ = auVar56._12_4_;
      auVar61 = auVar23 & auVar75 | auVar82;
      auVar61 = packssdw(auVar61,auVar61);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar10,auVar61 ^ auVar10);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar35[-0x140] = false;
      }
      auVar61 = pshufhw(auVar61,auVar75,0x84);
      auVar24._4_4_ = iVar79;
      auVar24._0_4_ = iVar79;
      auVar24._8_4_ = iVar83;
      auVar24._12_4_ = iVar83;
      auVar41 = pshufhw(auVar56,auVar24,0x84);
      auVar66 = pshufhw(auVar61,auVar82,0x84);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar66 | auVar41 & auVar61) ^ auVar46;
      auVar61 = packssdw(auVar46,auVar46);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._10_2_ >> 8 & 1) != 0) {
        pbVar35[-0x100] = false;
      }
      auVar61 = (auVar58 | _DAT_00107020) ^ auVar33;
      auVar57._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar57._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar57._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar57._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar25._4_4_ = auVar57._0_4_;
      auVar25._0_4_ = auVar57._0_4_;
      auVar25._8_4_ = auVar57._8_4_;
      auVar25._12_4_ = auVar57._8_4_;
      auVar41 = pshuflw(auVar82,auVar25,0xe8);
      auVar47._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar47._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar47._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar47._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar76._4_4_ = auVar47._4_4_;
      auVar76._0_4_ = auVar47._4_4_;
      auVar76._8_4_ = auVar47._12_4_;
      auVar76._12_4_ = auVar47._12_4_;
      auVar61 = pshuflw(auVar47,auVar76,0xe8);
      auVar77._4_4_ = auVar57._4_4_;
      auVar77._0_4_ = auVar57._4_4_;
      auVar77._8_4_ = auVar57._12_4_;
      auVar77._12_4_ = auVar57._12_4_;
      auVar66 = pshuflw(auVar57,auVar77,0xe8);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 & auVar41,(auVar66 | auVar61 & auVar41) ^ auVar11);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar35[-0xc0] = false;
      }
      auVar26._4_4_ = auVar57._0_4_;
      auVar26._0_4_ = auVar57._0_4_;
      auVar26._8_4_ = auVar57._8_4_;
      auVar26._12_4_ = auVar57._8_4_;
      auVar77 = auVar76 & auVar26 | auVar77;
      auVar66 = packssdw(auVar77,auVar77);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61,auVar66 ^ auVar12);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._12_2_ >> 8 & 1) != 0) {
        pbVar35[-0x80] = false;
      }
      auVar61 = (auVar58 | _DAT_00107010) ^ auVar33;
      auVar48._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar48._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar48._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar48._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar78._4_4_ = auVar48._0_4_;
      auVar78._0_4_ = auVar48._0_4_;
      auVar78._8_4_ = auVar48._8_4_;
      auVar78._12_4_ = auVar48._8_4_;
      auVar59._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar59._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar62._4_4_ = auVar48._4_4_;
      auVar62._0_4_ = auVar48._4_4_;
      auVar62._8_4_ = auVar48._12_4_;
      auVar62._12_4_ = auVar48._12_4_;
      auVar66 = auVar59 & auVar78 | auVar62;
      auVar61 = packssdw(auVar48,auVar66);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar13,auVar61 ^ auVar13);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar35[-0x40] = false;
      }
      auVar61 = pshufhw(auVar61,auVar78,0x84);
      in_XMM2 = pshufhw(auVar66,auVar59,0x84);
      in_XMM2 = in_XMM2 & auVar61;
      auVar61 = pshufhw(auVar61,auVar62,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar61 | in_XMM2) ^ auVar49;
      auVar61 = packssdw(auVar49,auVar49);
      in_XMM1 = packsswb(auVar61,auVar61);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *pbVar35 = false;
      }
      uVar37 = uVar37 + 0x10;
      pbVar35 = pbVar35 + 0x400;
    } while (((uVar36 >> 6) + 0x10 & 0xfffffffffffffff0) != uVar37);
  }
  if (ppNVar38 != (pointer)0x0) {
    operator_delete(ppNVar38,(long)local_60.
                                   super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppNVar38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Index>> scc() {
        dual_dfs();
        std::vector<std::vector<Index>> result;
        auto reversed_topological_order = dual_dfs();
        for (auto i = reversed_topological_order.rbegin(); i != reversed_topological_order.rend(); ++i) {
            if (!(*i)->visited) {
                result.emplace_back();
                std::vector<const Node *> subgraph{};
                (*i)->primal_dfs(subgraph);
                for (auto j: subgraph) {
                    result.back().push_back(j->name);
                }
            }
        }
        for (auto &i: nodes) {
            TypeImpl::get(i).visited = false;
        }
        return result;
    }